

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

RefNode * __thiscall RefTable::Add(RefTable *this,SQHash mainpos,SQObject *obj)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  RefNode *pRVar4;
  RefNode *pRVar5;
  SQTable *pSVar6;
  
  pRVar4 = this->_freelist;
  pRVar5 = this->_buckets[mainpos];
  SVar2 = (pRVar4->obj).super_SQObject._type;
  pSVar6 = (pRVar4->obj).super_SQObject._unVal.pTable;
  (pRVar4->obj).super_SQObject._unVal = obj->_unVal;
  SVar3 = obj->_type;
  (pRVar4->obj).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((pRVar4->obj).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_buckets[mainpos] = pRVar4;
  this->_freelist = this->_freelist->next;
  pRVar4->next = pRVar5;
  this->_slotused = this->_slotused + 1;
  return pRVar4;
}

Assistant:

RefTable::RefNode *RefTable::Add(SQHash mainpos,SQObject &obj)
{
    RefNode *t = _buckets[mainpos];
    RefNode *newnode = _freelist;
    newnode->obj = obj;
    _buckets[mainpos] = newnode;
    _freelist = _freelist->next;
    newnode->next = t;
    assert(newnode->refs == 0);
    _slotused++;
    return newnode;
}